

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

bool fasttext::utils::containsSecond<float,int>
               (vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *container,
               int *value)

{
  __normal_iterator<const_std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  _Var1;
  
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::pair<float,int>const*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,__gnu_cxx::__ops::_Iter_pred<fasttext::utils::containsSecond<float,int>(std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>const&,int_const&)::_lambda(std::pair<float,int>const&)_1_>>
                    ((container->
                     super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (container->
                     super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish,value);
  return _Var1._M_current !=
         (container->
         super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)._M_impl
         .super__Vector_impl_data._M_finish;
}

Assistant:

bool containsSecond(
    const std::vector<std::pair<T1, T2>>& container,
    const T2& value) {
  return std::find_if(
             container.begin(),
             container.end(),
             [&value](const std::pair<T1, T2>& item) {
               return item.second == value;
             }) != container.end();
}